

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler_unittest.cc
# Opt level: O1

void anon_unknown.dwarf_39d8::do_free(void *p)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(anonymous_namespace)::allocate_lock);
  if (iVar1 == 0) {
    LOCK();
    (anonymous_namespace)::free_count = (anonymous_namespace)::free_count + 1;
    UNLOCK();
    free(p);
    pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::allocate_lock);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void do_free(void* p) {
  std::lock_guard l{allocate_lock};

  free_count++;
  free(p);
}